

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O1

uint64_t rnd64_r(rng_t *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (*state)[0];
  uVar2 = (*state)[1];
  uVar4 = (*state)[2] ^ uVar1;
  uVar3 = uVar2 ^ (*state)[3];
  (*state)[1] = uVar4 ^ uVar2;
  (*state)[0] = uVar1 ^ uVar3;
  (*state)[2] = uVar4 ^ uVar2 << 0x11;
  (*state)[3] = uVar3 << 0x2d | uVar3 >> 0x13;
  return (uVar2 * 0x280 | uVar2 * 5 >> 0x39) * 9;
}

Assistant:

uint64_t
rnd64_r(rng_t *state)
{
	uint64_t *s = (void *)state;

	const uint64_t result = rotl(s[1] * 5, 7) * 9;
	const uint64_t t = s[1] << 17;

	s[2] ^= s[0];
	s[3] ^= s[1];
	s[1] ^= s[2];
	s[0] ^= s[3];

	s[2] ^= t;

	s[3] = rotl(s[3], 45);

	return result;
}